

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O2

string * testing::internal::StreamableToString<long_long>
                   (string *__return_storage_ptr__,longlong *streamable)

{
  Message *this;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  Message::Message((Message *)&local_28);
  this = Message::operator<<((Message *)&local_28,streamable);
  Message::GetString_abi_cxx11_(__return_storage_ptr__,this);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}